

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<7,_451>::ElementInformation::verifySize(int NPL,int NI)

{
  char *args;
  undefined8 *puVar1;
  
  args = (char *)(ulong)(uint)(NI * 6);
  if (NI * 6 == NPL) {
    return;
  }
  tools::Log::error<char_const*>(args);
  tools::Log::info<char_const*>(args);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
  tools::Log::info<char_const*,int>("NI value: {}",NI);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NI ) {

  if ( NPL != NI * 6 ) {

    Log::error( "Encountered illegal NPL and NI values " );
    Log::info( "NPL must be equal to 6*NI for element information data" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NI value: {}", NI );
    throw std::exception();
  }
}